

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O3

void webrtc::WindowGenerator::KaiserBesselDerived(float alpha,size_t length,float *window)

{
  string *result;
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar8;
  undefined8 uVar6;
  undefined1 extraout_var [12];
  undefined1 auVar7 [16];
  undefined8 extraout_XMM0_Qb;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  size_t local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  FatalMessage local_198;
  
  local_198.stream_ = (ostringstream)0x1;
  local_198._1_3_ = 0;
  local_1d0 = length;
  local_1a8 = alpha;
  if ((length < 2) &&
     (result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                         (&local_1d0,(uint *)&local_198,"length > 1U"), result != (string *)0x0)) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x33,result);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  if (window != (float *)0x0) {
    uVar3 = local_1d0 + 1 >> 1;
    local_1a8 = local_1a8 * 3.1415927;
    lVar2 = 0;
    fVar9 = 0.0;
    fStack_1a4 = local_1a8;
    fStack_1a0 = local_1a8;
    fStack_19c = local_1a8;
    do {
      fVar5 = ((float)lVar2 * 4.0) / (float)local_1d0 + -1.0;
      fVar10 = fVar5 * fVar5;
      if ((NAN(fVar10)) && (NAN(fVar5 * 0.0 + fVar5 * 0.0))) {
        fVar10 = (float)__mulsc3(fVar5,0,fVar5,0);
      }
      fVar5 = csqrtf(1.0 - fVar10);
      auVar7._0_4_ = fVar5 * local_1a8;
      auVar7._4_4_ = extraout_var._0_4_ * fStack_1a4;
      auVar7._8_4_ = extraout_var._4_4_ * fStack_1a0;
      auVar7._12_4_ = extraout_var._8_4_ * fStack_19c;
      auVar7 = divps(auVar7,_DAT_0019f310);
      fVar12 = auVar7._0_4_;
      fVar8 = auVar7._4_4_;
      fVar15 = fVar12 * auVar7._8_4_;
      fVar16 = fVar12 * auVar7._12_4_;
      fVar10 = fVar12 * fVar12 - fVar8 * fVar8;
      fVar15 = fVar15 - fVar15;
      fVar16 = fVar16 - fVar16;
      fVar5 = fVar12 * fVar8 + fVar12 * fVar8;
      if ((NAN(fVar10)) && (NAN(fVar5))) {
        uVar6 = __mulsc3(auVar7._0_8_,fVar8,fVar12,fVar8);
        fVar10 = (float)uVar6;
        fVar5 = (float)((ulong)uVar6 >> 0x20);
        fVar15 = (float)extraout_XMM0_Qb;
        fVar16 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
      }
      fVar12 = fVar10 * 0.0045813 + 0.0360768;
      fVar14 = fVar10 * fVar12 - fVar5 * fVar5 * 0.0045813;
      fVar13 = fVar5 * fVar12 + fVar10 * fVar5 * 0.0045813;
      fVar12 = fVar5;
      fVar8 = fVar5;
      fVar11 = fVar5;
      fVar18 = fVar5;
      if ((NAN(fVar14)) && (NAN(fVar13))) {
        local_1c8 = fVar5;
        fStack_1c4 = fVar5;
        fStack_1c0 = fVar5;
        fStack_1bc = fVar5;
        local_1b8 = fVar10;
        fStack_1b4 = fVar5;
        fStack_1b0 = fVar15;
        fStack_1ac = fVar16;
        uVar6 = __mulsc3();
        fVar14 = (float)uVar6;
        fVar13 = (float)((ulong)uVar6 >> 0x20);
        fVar5 = local_1c8;
        fVar12 = fStack_1c4;
        fVar8 = fStack_1c0;
        fVar11 = fStack_1bc;
        fVar10 = local_1b8;
        fVar18 = fStack_1b4;
        fVar15 = fStack_1b0;
        fVar16 = fStack_1ac;
      }
      fVar17 = fVar10 * (fVar14 + 0.2659732) - fVar5 * fVar13;
      fVar14 = fVar5 * (fVar14 + 0.2659732) + fVar10 * fVar13;
      if ((NAN(fVar17)) && (NAN(fVar14))) {
        local_1c8 = fVar5;
        fStack_1c4 = fVar12;
        fStack_1c0 = fVar8;
        fStack_1bc = fVar11;
        local_1b8 = fVar10;
        fStack_1b4 = fVar18;
        fStack_1b0 = fVar15;
        fStack_1ac = fVar16;
        uVar6 = __mulsc3();
        fVar17 = (float)uVar6;
        fVar14 = (float)((ulong)uVar6 >> 0x20);
        fVar5 = local_1c8;
        fVar12 = fStack_1c4;
        fVar8 = fStack_1c0;
        fVar11 = fStack_1bc;
        fVar10 = local_1b8;
        fVar18 = fStack_1b4;
        fVar15 = fStack_1b0;
        fVar16 = fStack_1ac;
      }
      fVar13 = fVar10 * (fVar17 + 1.2067492) - fVar5 * fVar14;
      fVar14 = fVar5 * (fVar17 + 1.2067492) + fVar10 * fVar14;
      if ((NAN(fVar13)) && (NAN(fVar14))) {
        local_1c8 = fVar5;
        fStack_1c4 = fVar12;
        fStack_1c0 = fVar8;
        fStack_1bc = fVar11;
        local_1b8 = fVar10;
        fStack_1b4 = fVar18;
        fStack_1b0 = fVar15;
        fStack_1ac = fVar16;
        uVar6 = __mulsc3();
        fVar13 = (float)uVar6;
        fVar14 = (float)((ulong)uVar6 >> 0x20);
        fVar5 = local_1c8;
        fVar12 = fStack_1c4;
        fVar8 = fStack_1c0;
        fVar11 = fStack_1bc;
        fVar10 = local_1b8;
        fVar18 = fStack_1b4;
        fVar15 = fStack_1b0;
        fVar16 = fStack_1ac;
      }
      fVar17 = fVar10 * (fVar13 + 3.0899425) - fVar5 * fVar14;
      fVar14 = fVar5 * (fVar13 + 3.0899425) + fVar10 * fVar14;
      if ((NAN(fVar17)) && (NAN(fVar14))) {
        local_1c8 = fVar5;
        fStack_1c4 = fVar12;
        fStack_1c0 = fVar8;
        fStack_1bc = fVar11;
        local_1b8 = fVar10;
        fStack_1b4 = fVar18;
        fStack_1b0 = fVar15;
        fStack_1ac = fVar16;
        uVar6 = __mulsc3();
        fVar17 = (float)uVar6;
        fVar14 = (float)((ulong)uVar6 >> 0x20);
        fVar10 = local_1b8;
        fVar18 = fStack_1b4;
      }
      fVar5 = (fVar17 + 3.5156229) * fVar10 - fVar14 * fVar18;
      if ((NAN(fVar5)) && (NAN(fVar18 * (fVar17 + 3.5156229) + fVar10 * fVar14))) {
        fVar5 = (float)__mulsc3();
      }
      fVar9 = fVar9 + fVar5 + 1.0;
      window[lVar2] = fVar9;
      lVar2 = lVar2 + 1;
    } while (uVar3 + 1 != lVar2);
    uVar4 = local_1d0 - 1;
    if (uVar3 <= uVar4) {
      lVar2 = -local_1d0;
      do {
        fVar5 = window[local_1d0 + lVar2] / fVar9;
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        window[lVar2 + local_1d0] = fVar5;
        window[uVar4] = fVar5;
        uVar4 = uVar4 - 1;
        lVar2 = lVar2 + 1;
      } while (uVar3 <= uVar4);
    }
    if ((local_1d0 & 1) != 0) {
      fVar9 = window[uVar3 - 1] / fVar9;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      window[uVar3 - 1] = fVar9;
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Check failed: window != nullptr",0x1f);
  std::ios::widen((char)(ostream *)&local_198 +
                  (char)*(undefined8 *)(CONCAT44(local_198._4_4_,local_198._0_4_) + -0x18));
  std::ostream::put((char)&local_198);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void WindowGenerator::KaiserBesselDerived(float alpha, size_t length,
                                          float* window) {
  RTC_CHECK_GT(length, 1U);
  RTC_CHECK(window != nullptr);

  const size_t half = (length + 1) / 2;
  float sum = 0.0f;

  for (size_t i = 0; i <= half; ++i) {
    complex<float> r = (4.0f * i) / length - 1.0f;
    sum += I0(static_cast<float>(M_PI) * alpha * sqrt(1.0f - r * r)).real();
    window[i] = sum;
  }
  for (size_t i = length - 1; i >= half; --i) {
    window[length - i - 1] = sqrtf(window[length - i - 1] / sum);
    window[i] = window[length - i - 1];
  }
  if (length % 2 == 1) {
    window[half - 1] = sqrtf(window[half - 1] / sum);
  }
}